

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

void column_test_common_z2_operators<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>>
               (vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
                *matrix)

{
  initializer_list<bool> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<bool> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<bool> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<bool> __l_05;
  initializer_list<unsigned_int> __l_06;
  initializer_list<bool> __l_07;
  initializer_list<unsigned_int> __l_08;
  initializer_list<bool> __l_09;
  initializer_list<unsigned_int> __l_10;
  initializer_list<bool> __l_11;
  initializer_list<unsigned_int> __l_12;
  undefined8 uVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  lazy_ostream *plVar5;
  basic_cstring<const_char> local_9c0;
  basic_cstring<const_char> local_9b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_9a0;
  assertion_result local_980;
  basic_cstring<const_char> local_968;
  basic_cstring<const_char> local_958;
  basic_cstring<const_char> local_948;
  basic_cstring<const_char> local_938;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_928;
  assertion_result local_908;
  basic_cstring<const_char> local_8f0;
  basic_cstring<const_char> local_8e0;
  basic_cstring<const_char> local_8d0;
  basic_cstring<const_char> local_8c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_8b0;
  assertion_result local_890;
  basic_cstring<const_char> local_878;
  basic_cstring<const_char> local_868;
  basic_cstring<const_char> local_858;
  basic_cstring<const_char> local_848;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_838;
  assertion_result local_818;
  basic_cstring<const_char> local_800;
  basic_cstring<const_char> local_7f0;
  bool local_7df [7];
  iterator local_7d8;
  undefined8 local_7d0;
  uint local_7c8 [4];
  iterator local_7b8;
  undefined8 local_7b0;
  Field_element local_7a8;
  bool local_7a7 [7];
  iterator local_7a0;
  undefined8 local_798;
  uint local_790 [4];
  iterator local_780;
  undefined8 local_778;
  Field_element local_769;
  basic_cstring<const_char> local_768;
  basic_cstring<const_char> local_758;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_748;
  assertion_result local_728;
  basic_cstring<const_char> local_710;
  basic_cstring<const_char> local_700;
  bool local_6ef [7];
  iterator local_6e8;
  undefined8 local_6e0;
  uint local_6d8 [8];
  iterator local_6b8;
  undefined8 local_6b0;
  Field_element local_6a1;
  basic_cstring<const_char> local_6a0;
  basic_cstring<const_char> local_690;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_680;
  assertion_result local_660;
  basic_cstring<const_char> local_648;
  basic_cstring<const_char> local_638;
  bool local_627 [7];
  iterator local_620;
  undefined8 local_618;
  uint local_60c [3];
  iterator local_600;
  undefined8 local_5f8;
  Field_element local_5e9;
  basic_cstring<const_char> local_5e8;
  basic_cstring<const_char> local_5d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_5c8;
  assertion_result local_5a8;
  basic_cstring<const_char> local_590;
  basic_cstring<const_char> local_580;
  basic_cstring<const_char> local_570;
  basic_cstring<const_char> local_560;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_550;
  assertion_result local_530;
  basic_cstring<const_char> local_518;
  basic_cstring<const_char> local_508;
  basic_cstring<const_char> local_4f8;
  basic_cstring<const_char> local_4e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_4d8;
  assertion_result local_4b8;
  basic_cstring<const_char> local_4a0;
  basic_cstring<const_char> local_490;
  basic_cstring<const_char> local_480;
  basic_cstring<const_char> local_470;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_460;
  assertion_result local_440;
  basic_cstring<const_char> local_428;
  basic_cstring<const_char> local_418;
  basic_cstring<const_char> local_408;
  basic_cstring<const_char> local_3f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_3e8;
  assertion_result local_3c8;
  basic_cstring<const_char> local_3b0;
  basic_cstring<const_char> local_3a0;
  bool local_38f [7];
  iterator local_388;
  undefined8 local_380;
  uint local_378 [8];
  iterator local_358;
  undefined8 local_350;
  bool local_347 [7];
  iterator local_340;
  undefined8 local_338;
  uint local_32c [3];
  iterator local_320;
  undefined8 local_318;
  Field_element local_30a;
  Field_element local_309;
  basic_cstring<const_char> local_308;
  basic_cstring<const_char> local_2f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2e8;
  assertion_result local_2c8;
  basic_cstring<const_char> local_2b0;
  basic_cstring<const_char> local_2a0;
  basic_cstring<const_char> local_290;
  basic_cstring<const_char> local_280;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_270;
  assertion_result local_250;
  basic_cstring<const_char> local_238;
  basic_cstring<const_char> local_228;
  basic_cstring<const_char> local_218;
  basic_cstring<const_char> local_208;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1f8;
  assertion_result local_1d8;
  basic_cstring<const_char> local_1c0;
  basic_cstring<const_char> local_1b0;
  basic_cstring<const_char> local_1a0;
  basic_cstring<const_char> local_190;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_180;
  assertion_result local_160;
  basic_cstring<const_char> local_148;
  basic_cstring<const_char> local_138;
  basic_cstring<const_char> local_128;
  basic_cstring<const_char> local_118;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_108;
  assertion_result local_e8;
  basic_cstring<const_char> local_d0;
  basic_cstring<const_char> local_c0;
  bool local_af [7];
  iterator local_a8;
  undefined8 local_a0;
  uint local_94 [3];
  iterator local_88;
  undefined8 local_80;
  undefined1 local_68 [8];
  vector<bool,_std::allocator<bool>_> veccont;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> setcont;
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
  *matrix_local;
  
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)local_68);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,1);
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,0);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
  ::operator+=(pvVar4,pvVar3);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,2);
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,1);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
  ::operator+=(pvVar4,pvVar3);
  local_94[0] = 2;
  local_94[1] = 3;
  local_94[2] = 6;
  local_88 = local_94;
  local_80 = 3;
  __l_12._M_len = 3;
  __l_12._M_array = local_88;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,__l_12);
  local_af[0] = false;
  local_af[1] = false;
  local_af[2] = true;
  local_af[3] = true;
  local_af[4] = false;
  local_af[5] = false;
  local_af[6] = true;
  local_a8 = local_af;
  local_a0 = 7;
  __l_11._M_len = 7;
  __l_11._M_array = local_a8;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l_11);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,0);
  column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>,unsigned_int>
            (pvVar3,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,
             (vector<bool,_std::allocator<bool>_> *)local_68);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c0,0x1c5,&local_d0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,1);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,1);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_e8,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_118,"matrix[1] == matrix[1]",0x16);
    boost::unit_test::operator<<(&local_108,plVar5,&local_118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_128,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_e8,&local_108,&local_128,0x1c5,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_108);
    boost::test_tools::assertion_result::~assertion_result(&local_e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_148);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_138,0x1c6,&local_148);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,1);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,3);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_160,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_190,"matrix[1] == matrix[3]",0x16);
    boost::unit_test::operator<<(&local_180,plVar5,&local_190);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_160,&local_180,&local_1a0,0x1c6,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_180);
    boost::test_tools::assertion_result::~assertion_result(&local_160);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1b0,0x1c7,&local_1c0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,1);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_1d8,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_208,"matrix[1] < matrix[0]",0x15);
    boost::unit_test::operator<<(&local_1f8,plVar5,&local_208);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_1d8,&local_1f8,&local_218,0x1c7,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1f8);
    boost::test_tools::assertion_result::~assertion_result(&local_1d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_238);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_228,0x1cb,&local_238);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,2);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_250,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_280,"matrix[2] < matrix[0]",0x15);
    boost::unit_test::operator<<(&local_270,plVar5,&local_280);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_250,&local_270,&local_290,0x1cb,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_270);
    boost::test_tools::assertion_result::~assertion_result(&local_250);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2a0,0x1cd,&local_2b0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,0);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_2c8,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f8,"!(matrix[0] < matrix[0])",0x18);
    boost::unit_test::operator<<(&local_2e8,plVar5,&local_2f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_308,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_2c8,&local_2e8,&local_308,0x1cd,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2e8);
    boost::test_tools::assertion_result::~assertion_result(&local_2c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_309 = true;
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,0);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
  ::operator*=(pvVar3,&local_309);
  local_30a = true;
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,2);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
  ::operator*=(pvVar3,&local_30a);
  local_32c[0] = 2;
  local_32c[1] = 3;
  local_32c[2] = 6;
  local_320 = local_32c;
  local_318 = 3;
  __l_10._M_len = 3;
  __l_10._M_array = local_320;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,__l_10);
  local_347[0] = false;
  local_347[1] = false;
  local_347[2] = true;
  local_347[3] = true;
  local_347[4] = false;
  local_347[5] = false;
  local_347[6] = true;
  local_340 = local_347;
  local_338 = 7;
  __l_09._M_len = 7;
  __l_09._M_array = local_340;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l_09);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,0);
  column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>,unsigned_int>
            (pvVar3,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,
             (vector<bool,_std::allocator<bool>_> *)local_68);
  local_378[0] = 0;
  local_378[1] = 1;
  local_378[2] = 2;
  local_378[3] = 5;
  local_378[4] = 6;
  local_358 = local_378;
  local_350 = 5;
  __l_08._M_len = 5;
  __l_08._M_array = local_358;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,__l_08);
  local_38f[0] = true;
  local_38f[1] = true;
  local_38f[2] = true;
  local_38f[3] = false;
  local_38f[4] = false;
  local_38f[5] = true;
  local_38f[6] = true;
  local_388 = local_38f;
  local_380 = 7;
  __l_07._M_len = 7;
  __l_07._M_array = local_388;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l_07);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,2);
  column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>,unsigned_int>
            (pvVar3,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,
             (vector<bool,_std::allocator<bool>_> *)local_68);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3a0,0x1d8,&local_3b0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,0);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,2);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_3c8,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3f8,"!(matrix[0] == matrix[2])",0x19);
    boost::unit_test::operator<<(&local_3e8,plVar5,&local_3f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_408,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_3c8,&local_3e8,&local_408,0x1d8,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_3e8);
    boost::test_tools::assertion_result::~assertion_result(&local_3c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_418,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_428);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_418,0x1d9,&local_428);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,2);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,2);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_440,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_470,"matrix[2] == matrix[2]",0x16);
    boost::unit_test::operator<<(&local_460,plVar5,&local_470);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_480,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_440,&local_460,&local_480,0x1d9,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_460);
    boost::test_tools::assertion_result::~assertion_result(&local_440);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_490,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_490,0x1da,&local_4a0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,1);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_4b8,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4e8,"matrix[1] < matrix[0]",0x15);
    boost::unit_test::operator<<(&local_4d8,plVar5,&local_4e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_4b8,&local_4d8,&local_4f8,0x1da,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_4d8);
    boost::test_tools::assertion_result::~assertion_result(&local_4b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_518);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_508,0x1de,&local_518);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,2);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_530,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_560,"matrix[2] < matrix[0]",0x15);
    boost::unit_test::operator<<(&local_550,plVar5,&local_560);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_570,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_530,&local_550,&local_570,0x1de,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_550);
    boost::test_tools::assertion_result::~assertion_result(&local_530);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_580,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_590);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_580,0x1e0,&local_590);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,0);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_5a8,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5d8,"!(matrix[0] < matrix[0])",0x18);
    boost::unit_test::operator<<(&local_5c8,plVar5,&local_5d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_5a8,&local_5c8,&local_5e8,0x1e0,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_5c8);
    boost::test_tools::assertion_result::~assertion_result(&local_5a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,4);
  local_5e9 = true;
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,5);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
  ::multiply_target_and_add(pvVar3,&local_5e9,pvVar4);
  local_60c[0] = 2;
  local_60c[1] = 3;
  local_60c[2] = 6;
  local_600 = local_60c;
  local_5f8 = 3;
  __l_06._M_len = 3;
  __l_06._M_array = local_600;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,__l_06);
  local_627[0] = false;
  local_627[1] = false;
  local_627[2] = true;
  local_627[3] = true;
  local_627[4] = false;
  local_627[5] = false;
  local_627[6] = true;
  local_620 = local_627;
  local_618 = 7;
  __l_05._M_len = 7;
  __l_05._M_array = local_620;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l_05);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,4);
  column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>,unsigned_int>
            (pvVar3,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,
             (vector<bool,_std::allocator<bool>_> *)local_68);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_638,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_648);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_638,0x1e7,&local_648);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,4);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_660,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_690,"matrix[4] == matrix[0]",0x16);
    boost::unit_test::operator<<(&local_680,plVar5,&local_690);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_660,&local_680,&local_6a0,0x1e7,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_680);
    boost::test_tools::assertion_result::~assertion_result(&local_660);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,5);
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,3);
  local_6a1 = true;
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
  ::multiply_source_and_add(pvVar3,pvVar4,&local_6a1);
  local_6d8[0] = 0;
  local_6d8[1] = 1;
  local_6d8[2] = 2;
  local_6d8[3] = 5;
  local_6d8[4] = 6;
  local_6b8 = local_6d8;
  local_6b0 = 5;
  __l_04._M_len = 5;
  __l_04._M_array = local_6b8;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,__l_04);
  local_6ef[0] = true;
  local_6ef[1] = true;
  local_6ef[2] = true;
  local_6ef[3] = false;
  local_6ef[4] = false;
  local_6ef[5] = true;
  local_6ef[6] = true;
  local_6e8 = local_6ef;
  local_6e0 = 7;
  __l_03._M_len = 7;
  __l_03._M_array = local_6e8;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l_03);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,5);
  column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>,unsigned_int>
            (pvVar3,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,
             (vector<bool,_std::allocator<bool>_> *)local_68);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_700,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_710);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_700,0x1ed,&local_710);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,5);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,2);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_728,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_758,"matrix[5] == matrix[2]",0x16);
    boost::unit_test::operator<<(&local_748,plVar5,&local_758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_768,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_728,&local_748,&local_768,0x1ed,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_748);
    boost::test_tools::assertion_result::~assertion_result(&local_728);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,5);
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,4);
  local_769 = true;
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
  ::multiply_source_and_add(pvVar3,pvVar4,&local_769);
  local_790[0] = 0;
  local_790[1] = 1;
  local_790[2] = 3;
  local_790[3] = 5;
  local_780 = local_790;
  local_778 = 4;
  __l_02._M_len = 4;
  __l_02._M_array = local_780;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,__l_02);
  local_7a7[0] = true;
  local_7a7[1] = true;
  local_7a7[2] = false;
  local_7a7[3] = true;
  local_7a7[4] = false;
  local_7a7[5] = true;
  local_7a7[6] = false;
  local_7a0 = local_7a7;
  local_798 = 7;
  __l_01._M_len = 7;
  __l_01._M_array = local_7a0;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l_01);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,5);
  column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>,unsigned_int>
            (pvVar3,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,
             (vector<bool,_std::allocator<bool>_> *)local_68);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,3);
  local_7a8 = true;
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,5);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
  ::multiply_target_and_add(pvVar3,&local_7a8,pvVar4);
  local_7c8[0] = 0;
  local_7c8[1] = 1;
  local_7c8[2] = 3;
  local_7c8[3] = 5;
  local_7b8 = local_7c8;
  local_7b0 = 4;
  __l_00._M_len = 4;
  __l_00._M_array = local_7b8;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,__l_00);
  local_7df[0] = true;
  local_7df[1] = true;
  local_7df[2] = false;
  local_7df[3] = true;
  local_7df[4] = false;
  local_7df[5] = true;
  local_7df[6] = false;
  local_7d8 = local_7df;
  local_7d0 = 7;
  __l._M_len = 7;
  __l._M_array = local_7d8;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,3);
  column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>,unsigned_int>
            (pvVar3,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,
             (vector<bool,_std::allocator<bool>_> *)local_68);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_800);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_7f0,0x1f8,&local_800);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,3);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,5);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_818,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_848,"matrix[3] == matrix[5]",0x16);
    boost::unit_test::operator<<(&local_838,plVar5,&local_848);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_858,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_818,&local_838,&local_858,0x1f8,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_838);
    boost::test_tools::assertion_result::~assertion_result(&local_818);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_868,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_878);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_868,0x1f9,&local_878);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,5);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,3);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_890,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8c0,"!(matrix[5] < matrix[3])",0x18);
    boost::unit_test::operator<<(&local_8b0,plVar5,&local_8c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_890,&local_8b0,&local_8d0,0x1f9,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_8b0);
    boost::test_tools::assertion_result::~assertion_result(&local_890);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_8f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_8e0,0x1fa,&local_8f0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,3);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,5);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_908,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_938,"!(matrix[3] < matrix[5])",0x18);
    boost::unit_test::operator<<(&local_928,plVar5,&local_938);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_948,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_908,&local_928,&local_948,0x1fa,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_928);
    boost::test_tools::assertion_result::~assertion_result(&local_908);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_958,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_968);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_958,0x1fb,&local_968);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,5);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,4);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_980,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9b0,"matrix[5] < matrix[4]",0x15);
    boost::unit_test::operator<<(&local_9a0,plVar5,&local_9b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_980,&local_9a0,&local_9c0,0x1fb,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_9a0);
    boost::test_tools::assertion_result::~assertion_result(&local_980);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_68)
  ;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage);
  return;
}

Assistant:

void column_test_common_z2_operators(std::vector<Column>& matrix) {
  std::set<unsigned int> setcont;
  std::vector<typename Column::Field_element> veccont;

  matrix[0] += matrix[1];
  matrix[1] += matrix[2];

  setcont = {2, 3, 6};
  veccont = {0, 0, 1, 1, 0, 0, 1};
  column_test_common_content_access(matrix[0], setcont, veccont);
  BOOST_CHECK(matrix[1] == matrix[1]);
  BOOST_CHECK(matrix[1] == matrix[3]);
  BOOST_CHECK(matrix[1] < matrix[0]);
  if constexpr (Column::Master::Option_list::column_type == Column_types::HEAP) {
    BOOST_CHECK(matrix[0] < matrix[2]);  // order different for heap columns
  } else {
    BOOST_CHECK(matrix[2] < matrix[0]);
  }
  BOOST_CHECK(!(matrix[0] < matrix[0]));

  matrix[0] *= 5;
  matrix[2] *= 1;

  setcont = {2, 3, 6};
  veccont = {0, 0, 1, 1, 0, 0, 1};
  column_test_common_content_access(matrix[0], setcont, veccont);
  setcont = {0, 1, 2, 5, 6};
  veccont = {1, 1, 1, 0, 0, 1, 1};
  column_test_common_content_access(matrix[2], setcont, veccont);
  BOOST_CHECK(!(matrix[0] == matrix[2]));
  BOOST_CHECK(matrix[2] == matrix[2]);
  BOOST_CHECK(matrix[1] < matrix[0]);
  if constexpr (Column::Master::Option_list::column_type == Column_types::HEAP) {
    BOOST_CHECK(matrix[0] < matrix[2]);  // order different for heap columns
  } else {
    BOOST_CHECK(matrix[2] < matrix[0]);
  }
  BOOST_CHECK(!(matrix[0] < matrix[0]));

  // this = v * this + column
  matrix[4].multiply_target_and_add(3, matrix[5]);
  setcont = {2, 3, 6};
  veccont = {0, 0, 1, 1, 0, 0, 1};
  column_test_common_content_access(matrix[4], setcont, veccont);
  BOOST_CHECK(matrix[4] == matrix[0]);
  // this = this + column * v
  matrix[5].multiply_source_and_add(matrix[3], 3);
  setcont = {0, 1, 2, 5, 6};
  veccont = {1, 1, 1, 0, 0, 1, 1};
  column_test_common_content_access(matrix[5], setcont, veccont);
  BOOST_CHECK(matrix[5] == matrix[2]);
  // this = this + column * v
  matrix[5].multiply_source_and_add(matrix[4], 3);
  setcont = {0, 1, 3, 5};
  veccont = {1, 1, 0, 1, 0, 1, 0};
  column_test_common_content_access(matrix[5], setcont, veccont);
  // this = v * this + column
  matrix[3].multiply_target_and_add(3, matrix[5]);
  setcont = {0, 1, 3, 5};
  veccont = {1, 1, 0, 1, 0, 1, 0};
  column_test_common_content_access(matrix[3], setcont, veccont);
  BOOST_CHECK(matrix[3] == matrix[5]);
  BOOST_CHECK(!(matrix[5] < matrix[3]));
  BOOST_CHECK(!(matrix[3] < matrix[5]));
  BOOST_CHECK(matrix[5] < matrix[4]);
}